

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# impulse.hpp
# Opt level: O1

value_type __thiscall
vista::circular::example::impulse<double,_2UL>::value(impulse<double,_2UL> *this)

{
  bool bVar1;
  uint uVar2;
  array<double,_2UL> *paVar3;
  value_type local_40;
  basic_iterator<const_double> local_38;
  iterator_type local_28;
  
  local_38.parent = &(this->window).super_circular_view<double,_2UL>;
  uVar2 = (uint)(this->window).super_circular_view<double,_2UL>.member.next;
  local_38.current =
       (size_type)(uVar2 - (int)(this->window).super_circular_view<double,_2UL>.member.size & 3);
  local_28.current = (size_type)(uVar2 & 3);
  local_28.parent = local_38.parent;
  bVar1 = circular_view<double,_2UL>::basic_iterator<const_double>::operator==(&local_38,&local_28);
  local_40 = 0.0;
  if (!bVar1) {
    paVar3 = &this->coefficients;
    local_40 = 0.0;
    do {
      if (local_38.parent == (circular_view<double,_2UL> *)0x0) {
        __assert_fail("parent",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/include/vista/detail/circular_view.ipp"
                      ,0x3b6,
                      "reference vista::circular_view<double, 2>::basic_iterator<const double>::operator*() [T = double, Extent = 2, U = const double]"
                     );
      }
      local_40 = local_40 +
                 ((local_38.parent)->member).data[(uint)local_38.current & 1] * paVar3->_M_elems[0];
      local_38.current = (size_type)((uint)local_38.current + 1 & 3);
      paVar3 = (array<double,_2UL> *)(paVar3->_M_elems + 1);
      bVar1 = circular_view<double,_2UL>::basic_iterator<const_double>::operator==
                        (&local_38,&local_28);
    } while (!bVar1);
  }
  return local_40;
}

Assistant:

value_type value() const
    {
        return std::inner_product(window.begin(),
                                  window.end(),
                                  coefficients.begin(),
                                  value_type{});
    }